

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

I32 write_laszip_vlr_payload(laszip_dll_struct *laszip_dll,LASzip *laszip,ByteStreamOut *out)

{
  unsigned_short *puVar1;
  long lVar2;
  ulong uVar3;
  U16 type;
  undefined2 local_3a;
  laszip_dll_struct *local_38;
  
  (*out->_vptr_ByteStreamOut[2])(out,&laszip->compressor);
  (*out->_vptr_ByteStreamOut[2])(out,&laszip->coder);
  (*out->_vptr_ByteStreamOut[1])(out,&laszip->version_major,1);
  (*out->_vptr_ByteStreamOut[1])(out,&laszip->version_minor,1);
  (*out->_vptr_ByteStreamOut[2])(out,&laszip->version_revision);
  (*out->_vptr_ByteStreamOut[3])(out,&laszip->options);
  (*out->_vptr_ByteStreamOut[3])(out,&laszip->chunk_size);
  (*out->_vptr_ByteStreamOut[4])(out,&laszip->number_of_special_evlrs);
  (*out->_vptr_ByteStreamOut[4])(out,&laszip->offset_to_special_evlrs);
  puVar1 = &laszip->num_items;
  (*out->_vptr_ByteStreamOut[2])(out,puVar1);
  if (*puVar1 != 0) {
    lVar2 = 4;
    uVar3 = 0;
    local_38 = laszip_dll;
    do {
      local_3a = (undefined2)laszip->items[uVar3].type;
      (*out->_vptr_ByteStreamOut[2])(out,&local_3a);
      (*out->_vptr_ByteStreamOut[2])(out,(long)&laszip->items->type + lVar2);
      (*out->_vptr_ByteStreamOut[2])(out,(long)&laszip->items->type + lVar2 + 2);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 8;
    } while (uVar3 < *puVar1);
  }
  return 0;
}

Assistant:

static I32
write_laszip_vlr_payload(
    laszip_dll_struct*                 laszip_dll
    , const LASzip*                    laszip
    , ByteStreamOut*                   out
)
{
  // write the LASzip VLR payload

  //     U16  compressor                2 bytes
  //     U32  coder                     2 bytes
  //     U8   version_major             1 byte
  //     U8   version_minor             1 byte
  //     U16  version_revision          2 bytes
  //     U32  options                   4 bytes
  //     I32  chunk_size                4 bytes
  //     I64  number_of_special_evlrs   8 bytes
  //     I64  offset_to_special_evlrs   8 bytes
  //     U16  num_items                 2 bytes
  //        U16 type                2 bytes * num_items
  //        U16 size                2 bytes * num_items
  //        U16 version             2 bytes * num_items
  // which totals 34+6*num_items

  try { out->put16bitsLE((const U8*)&(laszip->compressor)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing compressor %d", (I32)laszip->compressor);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->coder)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing coder %d", (I32)laszip->coder);
    return 1;
  }
  try { out->putBytes((const U8*)&(laszip->version_major), 1); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_major %d", (I32)laszip->version_major);
    return 1;
  }
  try { out->putBytes((const U8*)&(laszip->version_minor), 1); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_minor %d", (I32)laszip->version_minor);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->version_revision)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version_revision %d", (I32)laszip->version_revision);
    return 1;
  }
  try { out->put32bitsLE((const U8*)&(laszip->options)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing options %u", laszip->options);
    return 1;
  }
  try { out->put32bitsLE((const U8*)&(laszip->chunk_size)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing chunk_size %u", laszip->chunk_size);
    return 1;
  }
  try { out->put64bitsLE((const U8*)&(laszip->number_of_special_evlrs)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing number_of_special_evlrs %d", (I32)laszip->number_of_special_evlrs);
    return 1;
  }
  try { out->put64bitsLE((const U8*)&(laszip->offset_to_special_evlrs)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing offset_to_special_evlrs %d", (I32)laszip->offset_to_special_evlrs);
    return 1;
  }
  try { out->put16bitsLE((const U8*)&(laszip->num_items)); } catch(...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing num_items %d", (I32)laszip->num_items);
    return 1;
  }

  U32 j;
  for (j = 0; j < laszip->num_items; j++)
  {
    U16 type = (U16)(laszip->items[j].type);
    try { out->put16bitsLE((const U8*)&type); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing type %d of item %d", (I32)laszip->items[j].type, j);
      return 1;
    }
    try { out->put16bitsLE((const U8*)&(laszip->items[j].size)); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing size %d of item %d", (I32)laszip->items[j].size, j);
      return 1;
    }
    try { out->put16bitsLE((const U8*)&(laszip->items[j].version)); } catch(...)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "writing version %d of item %d", (I32)laszip->items[j].version, j);
      return 1;
    }
  }
  return 0;
}